

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-gui.cpp
# Opt level: O2

bool Gui::render(Objects *objects)

{
  float fVar1;
  PFNGLVIEWPORTPROC p_Var2;
  ImGuiIO *pIVar3;
  ImDrawData *draw_data;
  
  ImGui::Render();
  SDL_GL_MakeCurrent(objects->window,objects->gl_context);
  p_Var2 = gl3wViewport;
  pIVar3 = ImGui::GetIO();
  fVar1 = (pIVar3->DisplaySize).x;
  pIVar3 = ImGui::GetIO();
  (*p_Var2)(0,0,(int)fVar1,(int)(pIVar3->DisplaySize).y);
  (*gl3wClearColor)(0.0,0.0,0.0,1.0);
  (*gl3wClear)(0x4000);
  draw_data = ImGui::GetDrawData();
  ImGui_ImplOpenGL3_RenderDrawData(draw_data);
  SDL_GL_SwapWindow(objects->window);
  return true;
}

Assistant:

bool render(const Objects & objects) {
    ImGui::Render();
    SDL_GL_MakeCurrent(objects.window, objects.gl_context);
    glViewport(0, 0, (int) ImGui::GetIO().DisplaySize.x, (int) ImGui::GetIO().DisplaySize.y);
    glClearColor(0.0f, 0.0f, 0.0f, 1.0f);
    glClear(GL_COLOR_BUFFER_BIT);
    ImGui_ImplOpenGL3_RenderDrawData(ImGui::GetDrawData());
    SDL_GL_SwapWindow(objects.window);

    return true;
}